

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O3

array<cv::RotatedRect,_10UL> *
ellipses::compute_final_ellipses_by_linear_interpolation
          (array<cv::RotatedRect,_10UL> *__return_storage_ptr__,
          array<cv::RotatedRect,_3UL> *ellipses,size_t ignored_index)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  float *pfVar5;
  long lVar6;
  size_t sVar7;
  double dVar8;
  double dVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar16;
  undefined1 auVar15 [16];
  double dVar17;
  double dVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar21;
  double dVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar25;
  double dVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  double dVar30;
  
  sVar7 = 0;
  memset(__return_storage_ptr__,0,200);
  pfVar5 = &ellipses->_M_elems[0].angle;
  dVar8 = 0.0;
  dVar11 = 0.0;
  dVar12 = 0.0;
  dVar13 = 0.0;
  dVar14 = 0.0;
  dVar16 = 0.0;
  dVar17 = 0.0;
  dVar20 = 0.0;
  dVar21 = 0.0;
  dVar24 = 0.0;
  dVar25 = 0.0;
  dVar26 = 0.0;
  do {
    if (ignored_index != sVar7) {
      dVar2 = (double)(long)sVar7;
      dVar25 = dVar25 + (double)(long)(sVar7 * sVar7);
      dVar26 = dVar26 + dVar2;
      dVar12 = dVar12 + (double)*pfVar5;
      dVar29 = (double)(((RotatedRect *)(pfVar5 + -4))->center).x;
      dVar30 = (double)(((RotatedRect *)(pfVar5 + -4))->center).y;
      dVar3 = (double)(*(Size2f *)(pfVar5 + -2)).width;
      dVar4 = (double)(*(Size2f *)(pfVar5 + -2)).height;
      dVar13 = dVar13 + (double)*pfVar5 * dVar2;
      dVar21 = dVar21 + dVar3;
      dVar24 = dVar24 + dVar4;
      dVar17 = dVar17 + dVar29;
      dVar20 = dVar20 + dVar30;
      dVar14 = dVar14 + dVar3 * dVar2;
      dVar16 = dVar16 + dVar4 * dVar2;
      dVar8 = dVar8 + dVar2 * dVar29;
      dVar11 = dVar11 + dVar2 * dVar30;
    }
    sVar7 = sVar7 + 1;
    pfVar5 = pfVar5 + 5;
  } while (sVar7 != 3);
  dVar2 = (double)(int)(3 - (uint)(ignored_index < 3));
  dVar25 = dVar2 * dVar25 - dVar26 * dVar26;
  dVar13 = (dVar13 * dVar2 - dVar12 * dVar26) / dVar25;
  uVar27 = (undefined4)((ulong)dVar2 >> 0x20);
  auVar9._0_8_ = dVar8 * dVar2 - dVar17 * dVar26;
  auVar9._8_8_ = dVar11 * dVar2 - dVar20 * dVar26;
  auVar15._0_8_ = dVar14 * dVar2 - dVar21 * dVar26;
  auVar15._8_8_ = dVar16 * dVar2 - dVar24 * dVar26;
  uVar28 = (undefined4)((ulong)dVar25 >> 0x20);
  auVar10._8_4_ = SUB84(dVar25,0);
  auVar10._0_8_ = dVar25;
  auVar10._12_4_ = uVar28;
  auVar15 = divpd(auVar15,auVar10);
  auVar23._8_4_ = SUB84(dVar25,0);
  auVar23._0_8_ = dVar25;
  auVar23._12_4_ = uVar28;
  auVar10 = divpd(auVar9,auVar23);
  auVar18._0_8_ = dVar17 - auVar10._0_8_ * dVar26;
  auVar18._8_8_ = dVar20 - auVar10._8_8_ * dVar26;
  auVar22._0_8_ = dVar21 - dVar26 * auVar15._0_8_;
  auVar22._8_8_ = dVar24 - dVar26 * auVar15._8_8_;
  auVar19._8_4_ = SUB84(dVar2,0);
  auVar19._0_8_ = dVar2;
  auVar19._12_4_ = uVar27;
  auVar23 = divpd(auVar22,auVar19);
  auVar1._8_4_ = SUB84(dVar2,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = uVar27;
  auVar19 = divpd(auVar18,auVar1);
  pfVar5 = &__return_storage_ptr__->_M_elems[0].angle;
  lVar6 = 0;
  do {
    dVar8 = (double)lVar6 * 0.5 + -0.5;
    (((RotatedRect *)(pfVar5 + -4))->center).x = (float)(auVar10._0_8_ * dVar8 + auVar19._0_8_);
    pfVar5[-3] = (float)(auVar10._8_8_ * dVar8 + auVar19._8_8_);
    ((Size2f *)(pfVar5 + -2))->width = (float)(dVar8 * auVar15._0_8_ + auVar23._0_8_);
    pfVar5[-1] = (float)(dVar8 * auVar15._8_8_ + auVar23._8_8_);
    *pfVar5 = (float)(dVar13 * dVar8 + (dVar12 - dVar13 * dVar26) / dVar2);
    lVar6 = lVar6 + 1;
    pfVar5 = pfVar5 + 5;
  } while (lVar6 != 10);
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::RotatedRect, 10> compute_final_ellipses_by_linear_interpolation(
    const std::array<cv::RotatedRect, 3>& ellipses, std::size_t ignored_index)
{
    std::array<cv::RotatedRect, 10> result = {};

    auto sample_size = ellipses.size();
    if(ignored_index < ellipses.size())
        sample_size--;

    double x_sum, x_x_sum, height_sum, x_height_sum, width_sum, x_width_sum, angle_sum, x_angle_sum, centerx_sum,
        x_centerx_sum, centery_sum, x_centery_sum;
    x_sum = x_x_sum = height_sum = x_height_sum = width_sum = x_width_sum = angle_sum = x_angle_sum = centerx_sum
        = x_centerx_sum = centery_sum = x_centery_sum = 0;

    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        if(i != ignored_index)
        {
            x_sum += i;
            x_x_sum += i * i;

            height_sum += ellipses[i].size.height;
            x_height_sum += i * double(ellipses[i].size.height);

            width_sum += ellipses[i].size.width;
            x_width_sum += i * double(ellipses[i].size.width);

            angle_sum += ellipses[i].angle;
            x_angle_sum += i * double(ellipses[i].angle);

            centerx_sum += ellipses[i].center.x;
            x_centerx_sum += i * double(ellipses[i].center.x);
            centery_sum += ellipses[i].center.y;
            x_centery_sum += i * double(ellipses[i].center.y);
        }
    }

    double x_square = (sample_size * x_x_sum - x_sum * x_sum);

    double height_coef = (sample_size * x_height_sum - x_sum * height_sum) / x_square;
    double height_constant = (height_sum - height_coef * x_sum) / sample_size;

    double width_coef = (sample_size * x_width_sum - x_sum * width_sum) / x_square;
    double width_constant = (width_sum - width_coef * x_sum) / sample_size;

    double angle_coef = (sample_size * x_angle_sum - x_sum * angle_sum) / x_square;
    double angle_constant = (angle_sum - angle_coef * x_sum) / sample_size;

    double centerx_coef = (sample_size * x_centerx_sum - x_sum * centerx_sum) / x_square;
    double centerx_constant = (centerx_sum - centerx_coef * x_sum) / sample_size;
    double centery_coef = (sample_size * x_centery_sum - x_sum * centery_sum) / x_square;
    double centery_constant = (centery_sum - centery_coef * x_sum) / sample_size;

    for(std::size_t i = 0; i < result.size(); i++)
    {
        auto x = i * 0.5 - 0.5;
        cv::Point2f center(float(centerx_coef * x + centerx_constant), float(centery_coef * x + centery_constant));
        cv::Size2f size(float(width_coef * x + width_constant), float(height_coef * x + height_constant));
        float angle = float(angle_coef * x + angle_constant);
        result[i] = cv::RotatedRect(center, size, angle);
    }

    return result;
}